

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesDeviceGetOverclockDomains(zes_device_handle_t hDevice,uint32_t *pOverclockDomains)

{
  zes_pfnDeviceGetOverclockDomains_t pfnGetOverclockDomains;
  ze_result_t result;
  uint32_t *pOverclockDomains_local;
  zes_device_handle_t hDevice_local;
  
  pfnGetOverclockDomains._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cab8 != (code *)0x0) {
    pfnGetOverclockDomains._4_4_ = (*DAT_0011cab8)(hDevice,pOverclockDomains);
  }
  return pfnGetOverclockDomains._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceGetOverclockDomains(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t* pOverclockDomains                     ///< [in,out] Returns the overclock domains that are supported (a bit for
                                                        ///< each of enum ::zes_overclock_domain_t). If no bits are set, the device
                                                        ///< doesn't support overclocking.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetOverclockDomains = context.zesDdiTable.Device.pfnGetOverclockDomains;
        if( nullptr != pfnGetOverclockDomains )
        {
            result = pfnGetOverclockDomains( hDevice, pOverclockDomains );
        }
        else
        {
            // generic implementation
        }

        return result;
    }